

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall icu_63::DecimalFormat::setPadCharacter(DecimalFormat *this,UnicodeString *padChar)

{
  ushort uVar1;
  short sVar2;
  DecimalFormatProperties *pDVar3;
  UBool UVar4;
  int iVar5;
  UChar32 ch;
  int iVar6;
  bool bVar7;
  UErrorCode localStatus;
  UnicodeString local_50;
  
  pDVar3 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  uVar1 = (padChar->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      iVar5 = (padChar->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)(short)uVar1 >> 5;
    }
    sVar2 = (pDVar3->padString).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar6 = (pDVar3->padString).fUnion.fFields.fLength;
    }
    else {
      iVar6 = (int)sVar2 >> 5;
    }
    bVar7 = false;
    if ((((int)sVar2 & 1U) == 0) && (bVar7 = false, iVar5 == iVar6)) {
      UVar4 = UnicodeString::doEquals(padChar,&pDVar3->padString,iVar5);
      bVar7 = UVar4 != '\0';
    }
  }
  else {
    bVar7 = (bool)(*(byte *)&(pDVar3->padString).fUnion & 1);
  }
  if (bVar7 == false) {
    sVar2 = (padChar->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar5 = (padChar->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar2 >> 5;
    }
    if (iVar5 < 1) {
      UnicodeString::setToBogus
                (&((this->fields->properties).
                   super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                  padString);
    }
    else {
      ch = UnicodeString::char32At(padChar,0);
      UnicodeString::UnicodeString(&local_50,ch);
      UnicodeString::moveFrom
                (&((this->fields->properties).
                   super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                  padString,&local_50);
      UnicodeString::~UnicodeString(&local_50);
    }
    local_50.super_Replaceable.super_UObject._vptr_UObject._0_4_ = 0;
    touch(this,(UErrorCode *)&local_50);
  }
  return;
}

Assistant:

void DecimalFormat::setPadCharacter(const UnicodeString& padChar) {
    if (padChar == fields->properties->padString) { return; }
    if (padChar.length() > 0) {
        fields->properties->padString = UnicodeString(padChar.char32At(0));
    } else {
        fields->properties->padString.setToBogus();
    }
    touchNoError();
}